

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  byte *pbVar1;
  short sVar2;
  Expr *pEVar3;
  uint uVar4;
  LogEst LVar5;
  int iVar6;
  Vdbe *p_00;
  int target;
  int iVar7;
  ulong x;
  long in_FS_OFFSET;
  int n;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  pEVar3 = p->pLimit;
  if (pEVar3 != (Expr *)0x0 && p->iLimit == 0) {
    target = pParse->nMem + 1;
    pParse->nMem = target;
    p->iLimit = target;
    p_00 = sqlite3GetVdbe(pParse);
    iVar6 = sqlite3ExprIsInteger(pEVar3->pLeft,(int *)&local_3c,pParse);
    uVar4 = local_3c;
    if (iVar6 == 0) {
      sqlite3ExprCode(pParse,pEVar3->pLeft,target);
      sqlite3VdbeAddOp3(p_00,0xd,target,0,0);
      iVar7 = 0x11;
      iVar6 = target;
LAB_0018cb2c:
      sqlite3VdbeAddOp3(p_00,iVar7,iVar6,iBreak,0);
    }
    else {
      x = (ulong)local_3c;
      sqlite3VdbeAddOp3(p_00,0x47,local_3c,target,0);
      if (x == 0) {
        iVar7 = 9;
        iVar6 = 0;
        goto LAB_0018cb2c;
      }
      if (-1 < (int)uVar4) {
        sVar2 = p->nSelectRow;
        LVar5 = sqlite3LogEst(x);
        if (LVar5 < sVar2) {
          LVar5 = sqlite3LogEst(x);
          p->nSelectRow = LVar5;
          pbVar1 = (byte *)((long)&p->selFlags + 1);
          *pbVar1 = *pbVar1 | 0x40;
        }
      }
    }
    pEVar3 = pEVar3->pRight;
    if (pEVar3 != (Expr *)0x0) {
      iVar7 = pParse->nMem;
      iVar6 = iVar7 + 1;
      pParse->nMem = iVar6;
      p->iOffset = iVar6;
      iVar7 = iVar7 + 2;
      pParse->nMem = iVar7;
      sqlite3ExprCode(pParse,pEVar3,iVar6);
      sqlite3VdbeAddOp3(p_00,0xd,iVar6,0,0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3VdbeAddOp3(p_00,0xa0,target,iVar7,iVar6);
        return;
      }
      goto LAB_0018cbc5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0018cbc5:
  __stack_chk_fail();
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  Expr *pLimit = p->pLimit;

  if( p->iLimit ) return;

  /*
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  if( pLimit ){
    assert( pLimit->op==TK_LIMIT );
    assert( pLimit->pLeft!=0 );
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(pLimit->pLeft, &n, pParse) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, pLimit->pLeft, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( pLimit->pRight ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, pLimit->pRight, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}